

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O3

void iCopyColors<cRGB,cBGRA,bCopyAlpha>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  BYTE BVar2;
  byte bVar3;
  undefined2 uVar4;
  int iVar5;
  EBlend EVar6;
  long lVar7;
  long lVar8;
  FSpecialColormap *pFVar9;
  long lVar10;
  int iVar11;
  BYTE *pBVar12;
  byte *pbVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  
  pFVar9 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_004ec78d_caseD_0:
    if (0 < count) {
      pBVar12 = pin + 2;
      lVar10 = 0;
      do {
        pout[lVar10 * 4 + 2] = pBVar12[-2];
        pout[lVar10 * 4 + 1] = pBVar12[-1];
        pout[lVar10 * 4] = *pBVar12;
        pout[lVar10 * 4 + 3] = 0xff;
        lVar10 = lVar10 + 1;
        pBVar12 = pBVar12 + step;
      } while (count != (int)lVar10);
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_004ec78d_caseD_0;
    case BLEND_ICEMAP:
      if (0 < count) {
        pbVar13 = pin + 2;
        lVar10 = 0;
        do {
          uVar16 = (uint)pbVar13[-1] * 0x8f + (uint)pbVar13[-2] * 0x4d +
                   ((uint)*pbVar13 + (uint)*pbVar13 * 8) * 4 >> 0xc;
          BVar2 = IcePalette[uVar16][1];
          pout[lVar10 * 4 + 2] = IcePalette[uVar16][0];
          pout[lVar10 * 4 + 1] = BVar2;
          pout[lVar10 * 4] = IcePalette[uVar16][2];
          pout[lVar10 * 4 + 3] = 0xff;
          lVar10 = lVar10 + 1;
          pbVar13 = pbVar13 + step;
        } while (count != (int)lVar10);
      }
      break;
    case BLEND_OVERLAY:
      if (0 < count) {
        pbVar13 = pin + 2;
        lVar10 = 0;
        do {
          iVar14 = inf->blendcolor[3];
          bVar3 = pbVar13[-1];
          iVar11 = inf->blendcolor[1];
          bVar1 = *pbVar13;
          iVar5 = inf->blendcolor[2];
          pout[lVar10 * 4 + 2] = (BYTE)((uint)pbVar13[-2] * iVar14 + inf->blendcolor[0] >> 0x10);
          pout[lVar10 * 4 + 1] = (BYTE)((uint)bVar3 * iVar14 + iVar11 >> 0x10);
          pout[lVar10 * 4] = (BYTE)((uint)bVar1 * iVar14 + iVar5 >> 0x10);
          pout[lVar10 * 4 + 3] = 0xff;
          lVar10 = lVar10 + 1;
          pbVar13 = pbVar13 + step;
        } while (count != (int)lVar10);
      }
      break;
    case BLEND_MODULATE:
      if (0 < count) {
        pbVar13 = pin + 2;
        lVar10 = 0;
        do {
          bVar3 = pbVar13[-1];
          iVar14 = inf->blendcolor[1];
          bVar1 = *pbVar13;
          iVar11 = inf->blendcolor[2];
          pout[lVar10 * 4 + 2] = (BYTE)((uint)pbVar13[-2] * inf->blendcolor[0] >> 0x10);
          pout[lVar10 * 4 + 1] = (BYTE)((uint)bVar3 * iVar14 >> 0x10);
          pout[lVar10 * 4] = (BYTE)((uint)bVar1 * iVar11 >> 0x10);
          pout[lVar10 * 4 + 3] = 0xff;
          lVar10 = lVar10 + 1;
          pbVar13 = pbVar13 + step;
        } while (count != (int)lVar10);
      }
      break;
    default:
      EVar6 = inf->blend;
      lVar10 = (long)EVar6;
      if (lVar10 < 0x21) {
        if ((BLEND_ICEMAP < EVar6) && (0 < count)) {
          iVar14 = 0x20 - EVar6;
          pbVar13 = pin + 2;
          lVar10 = 0;
          do {
            bVar3 = *pbVar13;
            iVar11 = ((uint)pbVar13[-1] * 0x8f + (uint)pbVar13[-2] * 0x4d +
                      ((uint)bVar3 + (uint)bVar3 * 8) * 4 >> 8) * (EVar6 + BLEND_MODULATE);
            lVar15 = (long)(int)((uint)pbVar13[-2] * iVar14 + iVar11) * 0x84210843;
            lVar7 = (long)(int)((uint)pbVar13[-1] * iVar14 + iVar11) * 0x84210843;
            lVar8 = (long)(int)((uint)bVar3 * iVar14 + iVar11) * 0x84210843;
            pout[lVar10 * 4 + 2] = (char)(uint)((ulong)lVar15 >> 0x24) - (char)(lVar15 >> 0x3f);
            pout[lVar10 * 4 + 1] = (char)(uint)((ulong)lVar7 >> 0x24) - (char)(lVar7 >> 0x3f);
            pout[lVar10 * 4] = (char)(uint)((ulong)lVar8 >> 0x24) - (char)(lVar8 >> 0x3f);
            pout[lVar10 * 4 + 3] = 0xff;
            lVar10 = lVar10 + 1;
            pbVar13 = pbVar13 + step;
          } while (count != (int)lVar10);
        }
      }
      else if (0 < count) {
        pbVar13 = pin + 2;
        lVar15 = 0;
        do {
          uVar17 = (ulong)((uint)pbVar13[-1] * 0x8f + (uint)pbVar13[-2] * 0x4d +
                           ((uint)*pbVar13 + (uint)*pbVar13 * 8) * 4 >> 8);
          uVar4 = *(undefined2 *)((long)pFVar9 + uVar17 * 4 + lVar10 * 0x518 + -0xa700);
          pout[lVar15 * 4 + 2] = *(BYTE *)((long)pFVar9 + uVar17 * 4 + lVar10 * 0x518 + -0xa6fe);
          *(undefined2 *)(pout + lVar15 * 4) = uVar4;
          pout[lVar15 * 4 + 3] = 0xff;
          lVar15 = lVar15 + 1;
          pbVar13 = pbVar13 + step;
        } while (count != (int)lVar15);
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}